

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

Expr * nivalis::anon_unknown_3::combine_expr
                 (Expr *__return_storage_ptr__,uint32_t opcode,Expr *a,Expr *b)

{
  pointer pAVar1;
  size_t sVar2;
  
  Expr::Expr(__return_storage_ptr__);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
            (&__return_storage_ptr__->ast,
             ((long)(a->ast).
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(a->ast).
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) +
             ((long)(b->ast).
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(b->ast).
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) + 1);
  pAVar1 = (__return_storage_ptr__->ast).
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1->opcode = opcode;
  (pAVar1->field_1).ref = 0xffffffffffffffff;
  pAVar1 = (a->ast).
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar2 = (long)(a->ast).
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  if (sVar2 != 0) {
    memmove((__return_storage_ptr__->ast).
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start + 1,pAVar1,sVar2);
  }
  pAVar1 = (b->ast).
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar2 = (long)(b->ast).
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  if (sVar2 != 0) {
    memmove((void *)((long)(a->ast).
                           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           ._M_impl.super__Vector_impl_data._M_finish +
                    (long)(__return_storage_ptr__->ast).
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                    (0x10 - (long)(a->ast).
                                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)),pAVar1,sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Expr combine_expr(uint32_t opcode, const Expr& a, const Expr& b) {
    Expr new_expr;
    new_expr.ast.resize(a.ast.size() + b.ast.size() + 1);
    new_expr.ast[0] = opcode;
    std::copy(a.ast.begin(), a.ast.end(), new_expr.ast.begin() + 1);
    std::copy(b.ast.begin(), b.ast.end(), new_expr.ast.begin() + a.ast.size() + 1);
    return new_expr;
}